

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadS64Leb128
          (BinaryReader *this,uint64_t *out_value,char *desc)

{
  Offset *pOVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  puVar2 = (this->state_).data;
  sVar3 = wabt::ReadS64Leb128(puVar2 + (this->state_).offset,puVar2 + this->read_end_,out_value);
  if (sVar3 == 0) {
    PrintError(this,"unable to read i64 leb128: %s","i64.const value");
  }
  else {
    pOVar1 = &(this->state_).offset;
    *pOVar1 = *pOVar1 + sVar3;
  }
  return (Result)(uint)(sVar3 == 0);
}

Assistant:

Result BinaryReader::ReadS64Leb128(uint64_t* out_value, const char* desc) {
  const uint8_t* p = state_.data + state_.offset;
  const uint8_t* end = state_.data + read_end_;
  size_t bytes_read = wabt::ReadS64Leb128(p, end, out_value);
  ERROR_UNLESS(bytes_read > 0, "unable to read i64 leb128: %s", desc);
  state_.offset += bytes_read;
  return Result::Ok;
}